

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::ReallocBuffer(FString *this,size_t newlen)

{
  FStringData *pFVar1;
  FStringData *pFVar2;
  
  pFVar2 = (FStringData *)this->Chars;
  if (1 < pFVar2[-1].RefCount) {
    pFVar1 = FStringData::Alloc(newlen);
    this->Chars = (char *)(pFVar1 + 1);
    pFVar1->Len = (uint)newlen;
    if (pFVar2[-1].Len < newlen) {
      newlen = (ulong)pFVar2[-1].Len;
    }
    memcpy(pFVar1 + 1,pFVar2,newlen);
    *(undefined1 *)((long)&pFVar1[1].Len + newlen) = 0;
    FStringData::Release(pFVar2 + -1);
    return;
  }
  if (pFVar2[-1].AllocLen < newlen) {
    pFVar2 = FStringData::Realloc(pFVar2 + -1,newlen);
    pFVar2 = pFVar2 + 1;
    this->Chars = (char *)pFVar2;
  }
  pFVar2[-1].Len = (uint)newlen;
  return;
}

Assistant:

void FString::ReallocBuffer (size_t newlen)
{
	if (Data()->RefCount > 1)
	{ // If more than one reference, we must use a new copy
		FStringData *old = Data();
		AllocBuffer (newlen);
		StrCopy (Chars, old->Chars(), newlen < old->Len ? newlen : old->Len);
		old->Release();
	}
	else
	{
		if (newlen > Data()->AllocLen)
		{
			Chars = (char *)(Data()->Realloc(newlen) + 1);
		}
		Data()->Len = (unsigned int)newlen;
	}
}